

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2App.cpp
# Opt level: O0

error<idx2::idx2_err_code> SetParams(idx2_file *Idx2,params *P)

{
  undefined1 auVar1 [11];
  params *this;
  size_t sVar2;
  error<idx2::idx2_err_code> eVar3;
  stref Dir;
  idx2_file *local_48 [2];
  params *local_38;
  params *P_local;
  idx2_file *Idx2_local;
  undefined5 uStack_1d;
  idx2_file *local_18;
  idx2_file **local_10;
  
  local_38 = P;
  P_local = (params *)Idx2;
  idx2::SetName(Idx2,(P->Meta).Name);
  idx2::SetField((idx2_file *)P_local,(local_38->Meta).Field);
  idx2::SetVersion((idx2_file *)P_local,&local_38->Version);
  idx2::SetDimensions((idx2_file *)P_local,&(local_38->Meta).Dims3);
  idx2::SetDataType((idx2_file *)P_local,(local_38->Meta).DType);
  idx2::SetBrickSize((idx2_file *)P_local,&local_38->BrickDims3);
  idx2::SetBricksPerChunk((idx2_file *)P_local,local_38->BricksPerChunk);
  idx2::SetChunksPerFile((idx2_file *)P_local,local_38->ChunksPerFile);
  idx2::SetBitPlanesPerChunk((idx2_file *)P_local,local_38->BitPlanesPerChunk);
  idx2::SetNumLevels((idx2_file *)P_local,(i8)local_38->NLevels);
  idx2::SetTolerance((idx2_file *)P_local,local_38->Tolerance);
  idx2::SetFilesPerDirectory((idx2_file *)P_local,local_38->FilesPerDir);
  this = P_local;
  local_48[0] = (idx2_file *)local_38->OutDir;
  local_10 = local_48;
  local_18 = local_48[0];
  sVar2 = strlen((char *)local_48[0]);
  Dir.field_0.Ptr = (str)(sVar2 & 0xffffffff);
  Dir._8_8_ = sVar2;
  idx2::SetDir((idx2 *)this,local_48[0],Dir);
  eVar3 = idx2::Finalize((idx2_file *)P_local,local_38);
  auVar1 = eVar3._0_11_;
  eVar3._11_5_ = uStack_1d;
  eVar3.Msg = (cstr)auVar1._0_8_;
  eVar3.Code = auVar1[8];
  eVar3.StackIdx = auVar1[9];
  eVar3.StrGened = (bool)auVar1[10];
  return eVar3;
}

Assistant:

static error<idx2_err_code>
SetParams(idx2_file* Idx2, params* P)
{
  SetName(Idx2, P->Meta.Name);
  SetField(Idx2, P->Meta.Field);
  SetVersion(Idx2, P->Version);
  SetDimensions(Idx2, P->Meta.Dims3);
  SetDataType(Idx2, P->Meta.DType);
  SetBrickSize(Idx2, P->BrickDims3);
  SetBricksPerChunk(Idx2, P->BricksPerChunk);
  SetChunksPerFile(Idx2, P->ChunksPerFile);
  SetBitPlanesPerChunk(Idx2, P->BitPlanesPerChunk);
  SetNumLevels(Idx2, (i8)P->NLevels);
  SetTolerance(Idx2, P->Tolerance);
  SetFilesPerDirectory(Idx2, P->FilesPerDir);
  SetDir(Idx2, P->OutDir);
  return Finalize(Idx2, P);
}